

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

StreamWriter * __thiscall Json::StreamWriterBuilder::newStreamWriter(StreamWriterBuilder *this)

{
  bool bVar1;
  bool bVar2;
  bool useSpecialFloats;
  UInt UVar3;
  int iVar4;
  uint precision;
  Value *pVVar5;
  BuiltStyledStreamWriter *this_00;
  char *pcVar6;
  Enum cs;
  Value *this_01;
  string colonSymbol;
  string nullSymbol;
  string cs_str;
  string indentation;
  string endingLineFeedSymbol;
  
  this_01 = &this->settings_;
  pVVar5 = Value::operator[](this_01,"indentation");
  Value::asString_abi_cxx11_(&indentation,pVVar5);
  pVVar5 = Value::operator[](this_01,"commentStyle");
  Value::asString_abi_cxx11_(&cs_str,pVVar5);
  pVVar5 = Value::operator[](this_01,"enableYAMLCompatibility");
  bVar1 = Value::asBool(pVVar5);
  pVVar5 = Value::operator[](this_01,"dropNullPlaceholders");
  bVar2 = Value::asBool(pVVar5);
  pVVar5 = Value::operator[](this_01,"useSpecialFloats");
  useSpecialFloats = Value::asBool(pVVar5);
  pVVar5 = Value::operator[](this_01,"precision");
  UVar3 = Value::asUInt(pVVar5);
  iVar4 = std::__cxx11::string::compare((char *)&cs_str);
  if (iVar4 == 0) {
    cs = All;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&cs_str);
    cs = None;
    if (iVar4 != 0) {
      colonSymbol._M_dataplus._M_p = (pointer)&colonSymbol.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&colonSymbol,"commentStyle must be \'All\' or \'None\'","");
      throwRuntimeError(&colonSymbol);
    }
  }
  colonSymbol._M_dataplus._M_p = (pointer)&colonSymbol.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&colonSymbol," : ","");
  if (bVar1) {
    pcVar6 = ": ";
  }
  else {
    if (indentation._M_string_length != 0) goto LAB_004c7f96;
    pcVar6 = ":";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&colonSymbol,0,(char *)colonSymbol._M_string_length,(ulong)pcVar6);
LAB_004c7f96:
  nullSymbol._M_dataplus._M_p = (pointer)&nullSymbol.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&nullSymbol,"null","");
  if (bVar2) {
    nullSymbol._M_string_length = 0;
    *nullSymbol._M_dataplus._M_p = '\0';
  }
  endingLineFeedSymbol._M_string_length = 0;
  endingLineFeedSymbol.field_2._M_local_buf[0] = '\0';
  endingLineFeedSymbol._M_dataplus._M_p = (pointer)&endingLineFeedSymbol.field_2;
  this_00 = (BuiltStyledStreamWriter *)operator_new(0xe0);
  precision = 0x11;
  if (UVar3 < 0x11) {
    precision = UVar3;
  }
  BuiltStyledStreamWriter::BuiltStyledStreamWriter
            (this_00,&indentation,cs,&colonSymbol,&nullSymbol,&endingLineFeedSymbol,useSpecialFloats
             ,precision);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)endingLineFeedSymbol._M_dataplus._M_p != &endingLineFeedSymbol.field_2) {
    operator_delete(endingLineFeedSymbol._M_dataplus._M_p,
                    CONCAT71(endingLineFeedSymbol.field_2._M_allocated_capacity._1_7_,
                             endingLineFeedSymbol.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nullSymbol._M_dataplus._M_p != &nullSymbol.field_2) {
    operator_delete(nullSymbol._M_dataplus._M_p,nullSymbol.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colonSymbol._M_dataplus._M_p != &colonSymbol.field_2) {
    operator_delete(colonSymbol._M_dataplus._M_p,colonSymbol.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cs_str._M_dataplus._M_p != &cs_str.field_2) {
    operator_delete(cs_str._M_dataplus._M_p,cs_str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)indentation._M_dataplus._M_p != &indentation.field_2) {
    operator_delete(indentation._M_dataplus._M_p,indentation.field_2._M_allocated_capacity + 1);
  }
  return &this_00->super_StreamWriter;
}

Assistant:

StreamWriter* StreamWriterBuilder::newStreamWriter() const
{
  JSONCPP_STRING indentation = settings_["indentation"].asString();
  JSONCPP_STRING cs_str = settings_["commentStyle"].asString();
  bool eyc = settings_["enableYAMLCompatibility"].asBool();
  bool dnp = settings_["dropNullPlaceholders"].asBool();
  bool usf = settings_["useSpecialFloats"].asBool(); 
  unsigned int pre = settings_["precision"].asUInt();
  CommentStyle::Enum cs = CommentStyle::All;
  if (cs_str == "All") {
    cs = CommentStyle::All;
  } else if (cs_str == "None") {
    cs = CommentStyle::None;
  } else {
    throwRuntimeError("commentStyle must be 'All' or 'None'");
  }
  JSONCPP_STRING colonSymbol = " : ";
  if (eyc) {
    colonSymbol = ": ";
  } else if (indentation.empty()) {
    colonSymbol = ":";
  }
  JSONCPP_STRING nullSymbol = "null";
  if (dnp) {
    nullSymbol.clear();
  }
  if (pre > 17) pre = 17;
  JSONCPP_STRING endingLineFeedSymbol;
  return new BuiltStyledStreamWriter(
      indentation, cs,
      colonSymbol, nullSymbol, endingLineFeedSymbol, usf, pre);
}